

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simplex_tree_extended_filtration_unit_test.cpp
# Opt level: O3

void basic_simplex_tree_extend_filtration_invoker::
     run<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>>
               (type<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> *param_1)

{
  undefined8 uVar1;
  basic_simplex_tree_extend_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_> t;
  basic_simplex_tree_extend_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>
  local_289;
  string local_288;
  undefined7 uStack_287;
  long local_278 [2];
  char *local_268;
  char *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  char *local_238;
  char *local_230;
  char *local_228;
  char *local_220;
  ostringstream local_218 [112];
  ios_base local_1a8 [264];
  undefined1 *local_a0;
  long local_98;
  undefined1 local_90;
  undefined7 uStack_8f;
  undefined1 *local_80;
  undefined1 *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
  ;
  local_220 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_extend_filtration",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture ctor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_40 = local_a0;
  local_38 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_228,0x1f);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_238 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
  ;
  local_230 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_extend_filtration",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture setup",0xf);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_50 = local_a0;
  local_48 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_238,0x1f);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
  ;
  local_240 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_extend_filtration",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" test entry",0xc);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_60 = local_a0;
  local_58 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_248,0x1f);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  basic_simplex_tree_extend_filtration<Gudhi::Simplex_tree<Gudhi::Simplex_tree_options_default>_>::
  test_method(&local_289);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
  ;
  local_250 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_extend_filtration",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"\" fixture teardown",0x12);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_70 = local_a0;
  local_68 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_258,0x1f);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  uVar1 = boost::unit_test::(anonymous_namespace)::unit_test_log;
  local_268 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Simplex_tree/test/simplex_tree_extended_filtration_unit_test.cpp"
  ;
  local_260 = "";
  memset(local_218,0,0x198);
  std::__cxx11::ostringstream::ostringstream(local_218);
  local_98 = 0;
  local_90 = 0;
  local_288 = (string)0x22;
  local_a0 = &local_90;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,(char *)&local_288,1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_218,"basic_simplex_tree_extend_filtration",0x24);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_218,"\" fixture dtor",0xe);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)&local_a0,&local_288);
  if ((long *)CONCAT71(uStack_287,local_288) != local_278) {
    operator_delete((long *)CONCAT71(uStack_287,local_288),local_278[0] + 1);
  }
  local_80 = local_a0;
  local_78 = local_a0 + local_98;
  boost::unit_test::unit_test_log_t::set_checkpoint(uVar1,&local_268,0x1f);
  if (local_a0 != &local_90) {
    operator_delete(local_a0,CONCAT71(uStack_8f,local_90) + 1);
  }
  std::__cxx11::ostringstream::~ostringstream(local_218);
  std::ios_base::~ios_base(local_1a8);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE_TEMPLATE(basic_simplex_tree_extend_filtration, Stree, list_of_tested_variants) {
  std::clog << "********************************************************************" << std::endl;
  std::clog << "BASIC SIMPLEX TREE EXTEND FILTRATION" << std::endl;
  Stree st;
  
  // Inserted simplex:
  //      5   4
  //      o   o
  //     / \ /
  //    o   o
  //   /2\ /3
  //  o   o
  //  1   0
  st.insert_simplex({0}, 1.0);
  st.insert_simplex({1}, 2.0);
  st.insert_simplex({2}, 3.0);
  st.insert_simplex({3}, 4.0);
  st.insert_simplex({4}, 5.0);
  st.insert_simplex({5}, 6.0);
  st.insert_simplex({0, 2});
  st.insert_simplex({1, 2});
  st.insert_simplex({0, 3});
  st.insert_simplex({2, 5});
  st.insert_simplex({3, 4});
  st.insert_simplex({3, 5});
  Stree copy(st);

  auto efd = st.extend_filtration();

  using Filtration_value = typename Stree::Filtration_value;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({6})), Filtration_value(-3.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0})), Filtration_value(-2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({1})), Filtration_value(-1.8));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({2})), Filtration_value(-1.6));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0, 2})), Filtration_value(-1.6));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({1, 2})), Filtration_value(-1.6));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3})), Filtration_value(-1.4));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0, 3})), Filtration_value(-1.4));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({4})), Filtration_value(-1.2));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3, 4})), Filtration_value(-1.2));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({5})), Filtration_value(-1.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({2, 5})), Filtration_value(-1.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3, 5})), Filtration_value(-1.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({5, 6})), Filtration_value(1.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({4, 6})), Filtration_value(1.2));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3, 6})), Filtration_value(1.4));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3, 4, 6})), Filtration_value(1.4));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({3, 5, 6})), Filtration_value(1.4));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({2, 6})), Filtration_value(1.6));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({2, 5, 6})), Filtration_value(1.6));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({1, 6})), Filtration_value(1.8));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({1, 2, 6})), Filtration_value(1.8));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0, 6})), Filtration_value(2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0, 2, 6})), Filtration_value(2.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(st.filtration(st.find({0, 3, 6})), Filtration_value(2.0));

  GUDHI_TEST_FLOAT_EQUALITY_CHECK(efd.minval, Filtration_value(1.0));
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(efd.maxval, Filtration_value(6.0));

  Filtration_value epsilon = 2 * std::numeric_limits<Filtration_value>::epsilon();
  Filtration_value filt;
  Gudhi::Extended_simplex_type est = Gudhi::Extended_simplex_type::EXTRA;
  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({0})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({0})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({1})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({1})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({2})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({2})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({3})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({3})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({4})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({4})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({5})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({5})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::UP);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  BOOST_CHECK(std::isnan(filt));
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::EXTRA);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({0, 6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({0})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::DOWN);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({1, 6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({1})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::DOWN);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({2, 6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({2})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::DOWN);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({3, 6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({3})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::DOWN);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({4, 6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({4})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::DOWN);

  std::tie(filt, est) = st.decode_extended_filtration(st.filtration(st.find({5, 6})), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  GUDHI_TEST_FLOAT_EQUALITY_CHECK(filt, copy.filtration(copy.find({5})), epsilon);
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::DOWN);

  // Test to the limit - Intervals are [-2., -1.] and [1., 2.]
  std::tie(filt, est) = st.decode_extended_filtration(Filtration_value(-2.1), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  BOOST_CHECK(std::isnan(filt));
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::EXTRA);

  std::tie(filt, est) = st.decode_extended_filtration(Filtration_value(2.1), efd);
  std::clog << filt << " - " << static_cast<int>(est) << std::endl;
  BOOST_CHECK(std::isnan(filt));
  BOOST_CHECK(est == Gudhi::Extended_simplex_type::EXTRA);
}